

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_Sequence_Test::~TEST_PluginTest_Sequence_Test(TEST_PluginTest_Sequence_Test *this)

{
  TEST_PluginTest_Sequence_Test *this_local;
  
  ~TEST_PluginTest_Sequence_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}